

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeSavepoint(Btree *p,int op,int iSavepoint)

{
  int *piVar1;
  uint uVar2;
  BtShared *pBt;
  int iVar3;
  
  iVar3 = 0;
  if ((p != (Btree *)0x0) && (p->inTrans == '\x02')) {
    pBt = p->pBt;
    if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
      btreeLockCarefully(p);
    }
    if ((((op != 2) || (pBt->pCursor == (BtCursor *)0x0)) ||
        (iVar3 = saveCursorsOnList(pBt->pCursor,0,(BtCursor *)0x0), iVar3 == 0)) &&
       (iVar3 = sqlite3PagerSavepoint(pBt->pPager,op,iSavepoint), iVar3 == 0)) {
      if ((iSavepoint < 0) && ((pBt->btsFlags & 0x10) != 0)) {
        pBt->nPage = 0;
      }
      iVar3 = newDatabase(pBt);
      uVar2 = *(uint *)(pBt->pPage1->aData + 0x1c);
      pBt->nPage = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(p);
      }
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSavepoint(Btree *p, int op, int iSavepoint){
  int rc = SQLITE_OK;
  if( p && p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
    assert( iSavepoint>=0 || (iSavepoint==-1 && op==SAVEPOINT_ROLLBACK) );
    sqlite3BtreeEnter(p);
    if( op==SAVEPOINT_ROLLBACK ){
      rc = saveAllCursors(pBt, 0, 0);
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3PagerSavepoint(pBt->pPager, op, iSavepoint);
    }
    if( rc==SQLITE_OK ){
      if( iSavepoint<0 && (pBt->btsFlags & BTS_INITIALLY_EMPTY)!=0 ){
        pBt->nPage = 0;
      }
      rc = newDatabase(pBt);
      pBt->nPage = get4byte(28 + pBt->pPage1->aData);

      /* The database size was written into the offset 28 of the header
      ** when the transaction started, so we know that the value at offset
      ** 28 is nonzero. */
      assert( pBt->nPage>0 );
    }
    sqlite3BtreeLeave(p);
  }
  return rc;
}